

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O0

void __thiscall SynthWidget::on_detailsButton_clicked(SynthWidget *this)

{
  QFrame *pQVar1;
  QIcon *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Master *this_00;
  QSettings *pQVar6;
  long *plVar7;
  QWidget *this_01;
  int *piVar8;
  QSize *pQVar9;
  QSize local_70;
  QSize newSize;
  QWidget *p;
  int heightDelta;
  QVariant local_50;
  QString local_30;
  byte local_11;
  SynthWidget *pSStack_10;
  bool newVisible;
  SynthWidget *this_local;
  
  pSStack_10 = this;
  bVar3 = QWidget::isVisible((QWidget *)(this->ui->super_Ui_SynthWidget).detailsFrame);
  local_11 = !bVar3;
  pQVar1 = (this->ui->super_Ui_SynthWidget).detailsFrame;
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,local_11);
  pQVar2 = (QIcon *)(this->ui->super_Ui_SynthWidget).detailsButton;
  getSynthDetailsIcon((bool)(local_11 & 1));
  QAbstractButton::setIcon(pQVar2);
  this_00 = Master::getInstance();
  pQVar6 = Master::getSettings(this_00);
  QString::QString(&local_30,"Master/showSynthDetails");
  QVariant::QVariant(&local_50,(bool)(local_11 & 1));
  QSettings::setValue((QString *)pQVar6,(QVariant *)&local_30);
  QVariant::~QVariant(&local_50);
  QString::~QString(&local_30);
  iVar4 = QWidget::height((QWidget *)(this->ui->super_Ui_SynthWidget).detailsFrame);
  plVar7 = (long *)QWidget::layout();
  iVar5 = (**(code **)(*plVar7 + 0x60))();
  p._0_4_ = iVar4 + iVar5;
  if ((local_11 & 1) == 0) {
    p._0_4_ = -(int)p;
    for (newSize = (QSize)this; newSize != (QSize)0x0;
        newSize = (QSize)QWidget::parentWidget((QWidget *)newSize)) {
      QWidget::updateGeometry();
    }
    QWidget::layout();
    QLayout::activate();
    QWidget::window();
    QWidget::layout();
    QLayout::activate();
  }
  this_01 = (QWidget *)QWidget::window();
  local_70 = QWidget::size(this_01);
  piVar8 = QSize::rheight(&local_70);
  *piVar8 = (int)p + *piVar8;
  pQVar9 = (QSize *)QWidget::window();
  QWidget::resize(pQVar9);
  return;
}

Assistant:

void SynthWidget::on_detailsButton_clicked() {
	bool newVisible = !ui->detailsFrame->isVisible();
	ui->detailsFrame->setVisible(newVisible);
	ui->detailsButton->setIcon(SynthWidget::getSynthDetailsIcon(newVisible));
	Master::getInstance()->getSettings()->setValue("Master/showSynthDetails", newVisible);

	// Adjust size of main window
	int heightDelta = ui->detailsFrame->height() + layout()->spacing();
	if (!newVisible) {
		heightDelta = -heightDelta;

		// Enforce relayout of widget hierarchy up to the main window to allow its shrinking
		QWidget *p = this;
		while (p != NULL) {
			p->updateGeometry();
			p = p->parentWidget();
		}
		layout()->activate();
		window()->layout()->activate();
	}

	// OK, widgets' layouts updated, now resize main window
	QSize newSize = window()->size();
	newSize.rheight() += heightDelta;
	window()->resize(newSize);
}